

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReptilePeople.cpp
# Opt level: O1

void __thiscall ReptilePeople::ReptilePeople(ReptilePeople *this,string *displayName)

{
  Dice *pDVar1;
  
  (this->super_Character).name._M_dataplus._M_p = (pointer)&(this->super_Character).name.field_2;
  (this->super_Character).name._M_string_length = 0;
  (this->super_Character).name.field_2._M_local_buf[0] = '\0';
  (this->super_Character).displayName._M_dataplus._M_p =
       (pointer)&(this->super_Character).displayName.field_2;
  (this->super_Character).displayName._M_string_length = 0;
  (this->super_Character).displayName.field_2._M_local_buf[0] = '\0';
  (this->super_Character)._vptr_Character = (_func_int **)&PTR_RollAttack_00109c20;
  std::__cxx11::string::_M_replace((ulong)&(this->super_Character).name,0,(char *)0x0,0x107113);
  std::__cxx11::string::_M_assign((string *)&(this->super_Character).displayName);
  (this->super_Character).alive = true;
  (this->super_Character).attackRolls = 3;
  (this->super_Character).attackDieSides = 6;
  (this->super_Character).defenceRolls = 1;
  (this->super_Character).defenceDieSides = 6;
  (this->super_Character).armor = 7;
  (this->super_Character).totalStrengthPoints = 0x12;
  (this->super_Character).currentStrengthPoints = 0x12;
  (this->super_Character).kills = 0;
  pDVar1 = (Dice *)operator_new(0x10);
  SozLibs::Dice::Dice(pDVar1,6);
  (this->super_Character).attackDie = pDVar1;
  pDVar1 = (Dice *)operator_new(0x10);
  SozLibs::Dice::Dice(pDVar1,(this->super_Character).defenceDieSides);
  (this->super_Character).defenseDie = pDVar1;
  return;
}

Assistant:

ReptilePeople::ReptilePeople(std::string displayName)
{
    name = "ReptilePeople";
    this->displayName = displayName;

    alive = true;
    attackDieSides = 6;
    attackRolls = 3;
    defenceDieSides = 6;
    defenceRolls = 1;

    armor = 7;
    totalStrengthPoints = 18;
    currentStrengthPoints = totalStrengthPoints;
    kills = 0;

    attackDie = new SozLibs::Dice(attackDieSides);
    defenseDie = new SozLibs::Dice(defenceDieSides);
}